

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

QString * __thiscall
MakefileGenerator::prlFileName(QString *__return_storage_ptr__,MakefileGenerator *this,bool fixify)

{
  QMakeProject *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  ProKey PStack_d8;
  ProString local_a8;
  QStringBuilder<ProString,_QString_&> local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pQVar1 = this->project;
  ProKey::ProKey(&PStack_d8,"PRL_TARGET");
  QMakeEvaluator::first(&local_a8,&pQVar1->super_QMakeEvaluator,&PStack_d8);
  ProString::ProString(&local_78.a,&local_a8);
  local_78.b = &Option::prl_ext;
  QStringBuilder<ProString,_QString_&>::convertTo<QString>(__return_storage_ptr__,&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_d8);
  if ((int)CONCAT71(in_register_00000011,fixify) != 0) {
    pQVar1 = this->project;
    ProKey::ProKey((ProKey *)&local_78,"DESTDIR");
    bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    if (!bVar5) {
      pQVar1 = this->project;
      ProKey::ProKey((ProKey *)&local_a8,"DESTDIR");
      QMakeEvaluator::first(&local_78.a,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_a8);
      ProString::toQString((QString *)&PStack_d8,&local_78.a);
      QString::prepend(__return_storage_ptr__,(QString *)&PStack_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    }
    fileFixify((QString *)&local_78,this,__return_storage_ptr__,(FileFixifyTypes)0x3,true);
    pDVar3 = (__return_storage_ptr__->d).d;
    pcVar4 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_78.a.m_string.d.d;
    (__return_storage_ptr__->d).ptr = local_78.a.m_string.d.ptr;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_78.a.m_string.d.size;
    local_78.a.m_string.d.d = pDVar3;
    local_78.a.m_string.d.ptr = pcVar4;
    local_78.a.m_string.d.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
MakefileGenerator::prlFileName(bool fixify)
{
    QString ret = project->first("PRL_TARGET") + Option::prl_ext;
    if(fixify) {
        if(!project->isEmpty("DESTDIR"))
            ret.prepend(project->first("DESTDIR").toQString());
        ret = fileFixify(ret, FileFixifyBackwards);
    }
    return ret;
}